

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_enumerators.cpp
# Opt level: O0

void __thiscall
Clasp::ModelEnumerator::BacktrackFinder::reason(BacktrackFinder *this,Solver *s,Literal p,LitVec *x)

{
  uint32 uVar1;
  Literal LVar2;
  undefined8 in_RCX;
  Solver *in_RSI;
  uint32 end;
  uint32 i;
  Var in_stack_ffffffffffffffbc;
  Solver *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint local_24;
  Literal local_4;
  
  local_24 = 1;
  Literal::var(&local_4);
  uVar1 = Solver::level(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  for (; local_24 <= uVar1; local_24 = local_24 + 1) {
    LVar2 = Solver::decision(in_RSI,(uint32)((ulong)in_RCX >> 0x20));
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(LVar2.rep_,in_stack_ffffffffffffffd0),(Literal *)in_RSI);
  }
  return;
}

Assistant:

void        reason(Solver& s, Literal p, LitVec& x){
		for (uint32 i = 1, end = s.level(p.var()); i <= end; ++i) {
			x.push_back(s.decision(i));
		}
	}